

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::CharSet<unsigned_int>::GetNextRange
          (CharSet<unsigned_int> *this,Char searchCharStart,Char *outLowerChar,Char *outHigherChar)

{
  code *pcVar1;
  Char CVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  uint uVar6;
  Char CVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  CharSet<char16_t> *pCVar12;
  Char local_34;
  Char local_32 [3];
  char16 currentLowChar;
  char16 currentHighChar;
  
  if (outLowerChar == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x675,"(outLowerChar != nullptr)","outLowerChar != nullptr");
    if (!bVar3) goto LAB_00e5dafd;
    *puVar5 = 0;
  }
  if (outHigherChar == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x676,"(outHigherChar != nullptr)","outHigherChar != nullptr");
    if (!bVar3) {
LAB_00e5dafd:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if (searchCharStart < 0x110000) {
    local_34 = L'\x01';
    local_32[0] = L'\0';
    uVar8 = (ulong)(searchCharStart >> 0x10);
    pCVar12 = this->characterPlanes + uVar8;
    do {
      bVar3 = CharSet<char16_t>::GetNextRange(pCVar12,(Char)searchCharStart,&local_34,local_32);
      CVar2 = local_32[0];
      CVar7 = local_34;
      if (bVar3) {
        if ((ushort)local_32[0] < (ushort)local_34) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                             ,0x68d,"(currentHighChar >= currentLowChar)",
                             "currentHighChar >= currentLowChar");
          if (!bVar3) goto LAB_00e5dafd;
          *puVar5 = 0;
        }
        uVar9 = (uint)uVar8;
        if (uVar9 < 0x11) {
          *outLowerChar = (uint)(ushort)CVar7 | uVar9 << 0x10;
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x27d,"(index < NumberOfPlanes)","index < NumberOfPlanes");
          if (!bVar3) goto LAB_00e5dafd;
          *puVar5 = 0;
          *outLowerChar = (uint)(ushort)CVar7 | uVar9 << 0x10;
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x27d,"(index < NumberOfPlanes)","index < NumberOfPlanes");
          if (!bVar3) goto LAB_00e5dafd;
          *puVar5 = 0;
        }
        *outHigherChar = uVar9 << 0x10 | (uint)(ushort)CVar2;
        if (0x10 < (int)(uVar9 + 1)) {
          return true;
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        lVar10 = (long)(int)(uVar9 + 1);
        pCVar12 = this->characterPlanes + (uVar8 & 0xffffffff);
        uVar9 = uVar9 * 0x10000;
        goto LAB_00e5d948;
      }
      uVar8 = uVar8 + 1;
      pCVar12 = pCVar12 + 1;
      searchCharStart = 0;
    } while (uVar8 != 0x11);
  }
  return false;
LAB_00e5d948:
  uVar9 = uVar9 + 0x10000;
  pCVar12 = pCVar12 + 1;
  bVar3 = CharSet<char16_t>::GetNextRange(pCVar12,L'\0',&local_34,local_32);
  if (!bVar3) {
    return true;
  }
  uVar4 = *outHigherChar;
  uVar11 = (uint)(ushort)local_34;
  if (lVar10 < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x27c,"(index >= 0)","index >= 0");
    CVar7 = local_32[0];
    if (!bVar3) goto LAB_00e5dafd;
    *puVar5 = 0;
    if (uVar11 + uVar9 != uVar4 + 1) {
      return true;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x27c,"(index >= 0)","index >= 0");
    if (!bVar3) goto LAB_00e5dafd;
    *puVar5 = 0;
    uVar4 = *outHigherChar;
    uVar6 = (int)lVar10 << 0x10;
  }
  else {
    uVar6 = uVar9;
    CVar7 = local_32[0];
    if (uVar11 + uVar9 != uVar4 + 1) {
      return true;
    }
  }
  if (((ushort)CVar7 | uVar6) <= uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x69a,"(this->AddOffset(currentHighChar, index) > *outHigherChar)",
                       "this->AddOffset(currentHighChar, index) > *outHigherChar");
    if (!bVar3) goto LAB_00e5dafd;
    *puVar5 = 0;
  }
  if (lVar10 < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x27c,"(index >= 0)","index >= 0");
    if (!bVar3) goto LAB_00e5dafd;
    *puVar5 = 0;
  }
  *outHigherChar = (ushort)CVar7 | uVar6;
  lVar10 = lVar10 + 1;
  if ((int)lVar10 == 0x11) {
    return true;
  }
  goto LAB_00e5d948;
}

Assistant:

bool CharSet<codepoint_t>::GetNextRange(Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar)
    {
        Assert(outLowerChar != nullptr);
        Assert(outHigherChar != nullptr);
        if (searchCharStart >= 0x110000)
        {
            return false;
        }

        char16 currentLowChar = 1, currentHighChar = 0;
        int index = this->CharToIndex(searchCharStart);
        char16 offsetLessSearchCharStart = this->RemoveOffset(searchCharStart);

        for (; index < NumberOfPlanes; index++)
        {
            if (this->characterPlanes[index].GetNextRange(offsetLessSearchCharStart, &currentLowChar, &currentHighChar))
            {
                break;
            }
            offsetLessSearchCharStart = 0x0;
        }

        if (index == NumberOfPlanes)
        {
            return false;
        }
        Assert(currentHighChar >= currentLowChar);
        // else found range
        *outLowerChar = this->AddOffset(currentLowChar, index);
        *outHigherChar = this->AddOffset(currentHighChar, index);

        // Check if range crosses plane boundaries
        index ++;
        for (; index < NumberOfPlanes; index++)
        {
            if (!this->characterPlanes[index].GetNextRange(0x0, &currentLowChar, &currentHighChar) || *outHigherChar + 1 != this->AddOffset(currentLowChar, index))
            {
                break;
            }
            Assert(this->AddOffset(currentHighChar, index) > *outHigherChar);
            *outHigherChar = this->AddOffset(currentHighChar, index);
        }

        return true;
    }